

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIListBox.cpp
# Opt level: O3

void __thiscall irr::gui::CGUIListBox::updateScrollBarSize(CGUIListBox *this,s32 size)

{
  IGUIElement *this_00;
  rect<int> local_10;
  
  this_00 = &this->ScrollBar->super_IGUIElement;
  if ((this_00->RelativeRect).LowerRightCorner.X - (this_00->RelativeRect).UpperLeftCorner.X != size
     ) {
    local_10.UpperLeftCorner.Y = 0;
    local_10.LowerRightCorner.X =
         (int)*(undefined8 *)&this->field_0x38 - (int)*(undefined8 *)&this->field_0x30;
    local_10.LowerRightCorner.Y =
         (int)((ulong)*(undefined8 *)&this->field_0x38 >> 0x20) -
         (int)((ulong)*(undefined8 *)&this->field_0x30 >> 0x20);
    local_10.UpperLeftCorner.X = local_10.LowerRightCorner.X - size;
    IGUIElement::setRelativePosition(this_00,&local_10);
  }
  return;
}

Assistant:

void CGUIListBox::updateScrollBarSize(s32 size)
{
	if (size != ScrollBar->getRelativePosition().getWidth()) {
		core::recti r(RelativeRect.getWidth() - size, 0, RelativeRect.getWidth(), RelativeRect.getHeight());
		ScrollBar->setRelativePosition(r);
	}
}